

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonPal.h
# Opt level: O3

HRESULT StringCchPrintfW(WCHAR *pszDest,size_t cchDest,WCHAR *pszFormat,...)

{
  size_t count;
  char in_AL;
  HRESULT HVar1;
  uint uVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list argList;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  HVar1 = -0x7ff8ffa9;
  if (cchDest < 0x80000000) {
    argList[0].overflow_arg_area = local_e8;
    argList[0]._0_8_ = &stack0x00000008;
    local_38._0_4_ = 0x18;
    local_38._4_4_ = 0x30;
    if (cchDest == 0) {
      HVar1 = -0x7ff8ffa9;
    }
    else {
      count = cchDest - 1;
      local_d0 = in_RCX;
      local_c8 = in_R8;
      local_c0 = in_R9;
      uVar2 = _vsnwprintf(pszDest,count,pszFormat,(__va_list_tag *)local_38);
      HVar1 = -0x7ff8ff86;
      if (((-1 < (int)uVar2) && (uVar2 <= count)) && (HVar1 = 0, count != uVar2)) {
        return 0;
      }
      pszDest[cchDest - 1] = L'\0';
    }
  }
  return HVar1;
}

Assistant:

STRSAFEAPI StringCchPrintfW(WCHAR* pszDest, size_t cchDest, const WCHAR* pszFormat, ...)
{
    HRESULT hr;

    if (cchDest > STRSAFE_MAX_CCH)
    {
        hr = STRSAFE_E_INVALID_PARAMETER;
    }
    else
    {
        va_list argList;

        va_start(argList, pszFormat);

        hr = StringVPrintfWorkerW(pszDest, cchDest, pszFormat, argList);

        va_end(argList);
    }

    return hr;
}